

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O0

WJTL_STATUS TestMarshallBinary(void)

{
  WJTL_STATUS WVar1;
  char *pcStack_248;
  _Bool _result_2;
  TestStruct2 theStruct2;
  JlMarshallElement marshalTestStruct2 [3];
  char acStack_f0 [6];
  _Bool _result_1;
  _Bool _result;
  TestStruct theStruct;
  JlMarshallElement marshalTestStruct [2];
  WJTL_STATUS local_c;
  WJTL_STATUS TestReturn;
  
  local_c = WJTL_STATUS_SUCCESS;
  memcpy(&theStruct.BinaryBlob2,&DAT_00150550,0xc0);
  memset(acStack_f0,0,0x18);
  WVar1 = MakeJson5AndVerify(acStack_f0,(JlMarshallElement *)&theStruct.BinaryBlob2,2,
                             "{FixedBlob:\'AAAAAAAAAAAAAA\',BinaryBlob2:\'AAAAAAAAAAA\'}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJson5AndVerify( &theStruct, marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), \"{FixedBlob:\'AAAAAAAAAAAAAA\',BinaryBlob2:\'AAAAAAAAAAA\'}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallBinary",0x29e);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  builtin_strncpy(acStack_f0,"ThisIs",6);
  _result_1 = true;
  _result = true;
  theStruct.FixedBlob[0] = 's';
  theStruct.FixedBlob[1] = 't';
  theStruct.FixedBlob[8] = 0xf0;
  theStruct.FixedBlob[9] = 0xde;
  theStruct._10_6_ = 0x123456789abc;
  WVar1 = MakeJson5AndVerify(acStack_f0,(JlMarshallElement *)&theStruct.BinaryBlob2,2,
                             "{FixedBlob:\'VGhpc0lzVGVzdA\',BinaryBlob2:\'8N68mnhWNBI\'}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJson5AndVerify( &theStruct, marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), \"{FixedBlob:\'VGhpc0lzVGVzdA\',BinaryBlob2:\'8N68mnhWNBI\'}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallBinary",0x2a4);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  memcpy(&theStruct2.VariableBlob3Size,&DAT_00150610,0x120);
  memset(&stack0xfffffffffffffdb8,0,0x30);
  pcStack_248 = "1234567890";
  theStruct2.VariableBlob1 = (uint8_t *)0xa;
  theStruct2.VariableBlob1Size = (size_t)anon_var_dwarf_96fd;
  theStruct2.VariableBlob2 = (void *)0x1a;
  WVar1 = MakeJson5AndVerify(&stack0xfffffffffffffdb8,
                             (JlMarshallElement *)&theStruct2.VariableBlob3Size,3,
                             "{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:\'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ\',VariableBlob3:null}"
                            );
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJson5AndVerify( &theStruct2, marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), \"{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:\'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ\',VariableBlob3:null}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallBinary",0x2c0);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  return local_c;
}

Assistant:

static
WJTL_STATUS
    TestMarshallBinary
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        uint8_t     FixedBlob[10];      // Treat as 80bit binary
        uint64_t    BinaryBlob2;        // Treat as 64bit binary
    } TestStruct;

    JlMarshallElement marshalTestStruct[] =
    {
        JlMarshallBinaryFixed( TestStruct, FixedBlob, "FixedBlob" ),
        JlMarshallBinaryFixed( TestStruct, BinaryBlob2, "BinaryBlob2" ),
    };

    TestStruct theStruct = {{0}};

    // Check marshalling zero values
    JL_ASSERT_SUCCESS( MakeJson5AndVerify( &theStruct, marshalTestStruct, NumElements(marshalTestStruct),
                                          "{FixedBlob:'AAAAAAAAAAAAAA',BinaryBlob2:'AAAAAAAAAAA'}" ) );

    // Check other values
    memcpy( theStruct.FixedBlob, "ThisIsTest", 10 );
    theStruct.BinaryBlob2 = 0x123456789ABCDEF0ULL;
    JL_ASSERT_SUCCESS( MakeJson5AndVerify( &theStruct, marshalTestStruct, NumElements(marshalTestStruct),
                                          "{FixedBlob:'VGhpc0lzVGVzdA',BinaryBlob2:'8N68mnhWNBI'}" ) );

    // Now Test with variable sized binary
    typedef struct
    {
        uint8_t*    VariableBlob1;
        size_t      VariableBlob1Size;
        void*       VariableBlob2;
        size_t      VariableBlob2Size;
        uint32_t*   VariableBlob3;
        size_t      VariableBlob3Size;
    } TestStruct2;

    JlMarshallElement marshalTestStruct2[] =
    {
        JlMarshallBinary( TestStruct2, VariableBlob1, VariableBlob1Size, "VariableBlob1" ),
        JlMarshallBinary( TestStruct2, VariableBlob2, VariableBlob2Size, "VariableBlob2" ),
        JlMarshallBinary( TestStruct2, VariableBlob3, VariableBlob3Size, "VariableBlob3" ),
    };

    TestStruct2 theStruct2 = {0};
    theStruct2.VariableBlob1 = (uint8_t*) "1234567890";
    theStruct2.VariableBlob1Size = 10;
    theStruct2.VariableBlob2 = "1234567890AAAABBBBCCCCDDDD";
    theStruct2.VariableBlob2Size = 26;

    JL_ASSERT_SUCCESS( MakeJson5AndVerify(
        &theStruct2, marshalTestStruct2, NumElements(marshalTestStruct2),
        "{VariableBlob1:'MTIzNDU2Nzg5MA',VariableBlob2:'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ',VariableBlob3:null}" ) );

    return TestReturn;
}